

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

vector<protozero::ContiguousMemoryRange,_std::allocator<protozero::ContiguousMemoryRange>_> *
__thiscall
protozero::ScatteredHeapBuffer::GetRanges
          (vector<protozero::ContiguousMemoryRange,_std::allocator<protozero::ContiguousMemoryRange>_>
           *__return_storage_ptr__,ScatteredHeapBuffer *this)

{
  pointer pSVar1;
  Slice *slice;
  pointer pSVar2;
  ContiguousMemoryRange local_30;
  
  (__return_storage_ptr__->
  super__Vector_base<protozero::ContiguousMemoryRange,_std::allocator<protozero::ContiguousMemoryRange>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<protozero::ContiguousMemoryRange,_std::allocator<protozero::ContiguousMemoryRange>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<protozero::ContiguousMemoryRange,_std::allocator<protozero::ContiguousMemoryRange>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  AdjustUsedSizeOfCurrentSlice(this);
  pSVar1 = (this->slices_).
           super__Vector_base<protozero::ScatteredHeapBuffer::Slice,_std::allocator<protozero::ScatteredHeapBuffer::Slice>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pSVar2 = (this->slices_).
                super__Vector_base<protozero::ScatteredHeapBuffer::Slice,_std::allocator<protozero::ScatteredHeapBuffer::Slice>_>
                ._M_impl.super__Vector_impl_data._M_start; pSVar2 != pSVar1; pSVar2 = pSVar2 + 1) {
    local_30.begin =
         (pSVar2->buffer_)._M_t.
         super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
         super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    local_30.end = local_30.begin + (pSVar2->size_ - pSVar2->unused_bytes_);
    perfetto::std::
    vector<protozero::ContiguousMemoryRange,_std::allocator<protozero::ContiguousMemoryRange>_>::
    emplace_back<protozero::ContiguousMemoryRange>(__return_storage_ptr__,&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<protozero::ContiguousMemoryRange> ScatteredHeapBuffer::GetRanges() {
  std::vector<protozero::ContiguousMemoryRange> ranges;
  for (const auto& slice : GetSlices())
    ranges.push_back(slice.GetUsedRange());
  return ranges;
}